

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void writeLengthField(FILE *outFile,uint32_t dataLength)

{
  int local_20;
  undefined1 local_1c [4];
  int i;
  uint8_t sizeFieldBytes [4];
  uint32_t sizeField;
  uint32_t dataLength_local;
  FILE *outFile_local;
  
  i = dataLength;
  sizeFieldBytes = (uint8_t  [4])dataLength;
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    local_1c[local_20] = (char)i;
    i = (uint)i >> 8;
  }
  fwrite(local_1c,4,1,(FILE *)outFile);
  return;
}

Assistant:

void writeLengthField(FILE* outFile, uint32_t dataLength){
	uint32_t sizeField;
	uint8_t sizeFieldBytes[4];
	sizeField = dataLength;
	for(int i = 0; i < 4; i++){
		sizeFieldBytes[i] = (uint8_t)(0xff & sizeField);
		sizeField >>= 8;
	}

	fwrite(sizeFieldBytes, 4, 1, outFile);
}